

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O2

void __thiscall
Js::StringProfiler::PrintOne(StringProfiler *this,uint len,StringMetrics metrics,uint totalCount)

{
  int in_register_00000034;
  
  Output::Print(L"%10u %10u %10u %10u %10u (%.1f%%)\n",
                ((double)(len + metrics.count7BitASCII + in_register_00000034) * 100.0) /
                (double)metrics.countUnicode,(ulong)this & 0xffffffff,
                CONCAT44(in_register_00000034,len),in_register_00000034);
  return;
}

Assistant:

void StringProfiler::PrintOne(
        unsigned int len,
        StringMetrics metrics,
        uint totalCount
        )
    {
        Output::Print(_u("%10u %10u %10u %10u %10u (%.1f%%)\n"),
                len,
                metrics.count7BitASCII,
                metrics.count8BitASCII,
                metrics.countUnicode,
                metrics.Total(),
                100.0*(double)metrics.Total()/(double)totalCount
                );
    }